

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O2

void handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>
               (request<boost::beast::http::basic_string_body<char>,_http::basic_fields<allocator<char>_>_>
                *req,send_lambda *send)

{
  verb vVar1;
  size_t sVar2;
  ulong uVar3;
  string_view query_00;
  RestCommand RVar4;
  bool bVar5;
  int iVar6;
  size_type sVar7;
  size_t sVar8;
  char *pcVar9;
  string_view target;
  string_view why;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  string_view why_00;
  string_view why_01;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  string_view content_type;
  string_view content_type_00;
  string_view content_type_01;
  string_view body;
  string_view target_00;
  string_view content_type_02;
  string_view content_type_03;
  string_view content_type_04;
  RestCommand local_1bc;
  anon_class_8_1_ba1d73fe response_ok;
  string brokerName;
  pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  res;
  anon_class_8_1_ba1d73fe bad_request;
  response<http::string_body> local_160;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
  reqpr;
  anon_class_8_1_ba1d73fe not_found;
  string targetObj;
  string query;
  string local_60;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  if ((handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
       ::index_page_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                                   ::index_page_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                ::index_page_abi_cxx11_,
               "<html>\n  <head>\n    <meta charset=\"utf-8\" />\n    <title>HELICS web server interface</title>\n    "
               ,(allocator<char> *)&local_160);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                ::index_page_abi_cxx11_,
               "<style>\nhtml {\n  font-size: 100%;\n  overflow-y: scroll;\n  -webkit-text-size-adjust: 100%;\n  -ms-text-size-adjust: 100%;\n}\n\nbody {\n  color: #444;\n  font-family: Georgia, Palatino, \'Palatino Linotype\', Times, \'Times New Roman\', serif;\n  font-size: 12px;\n  line-height: 1.7;\n  padding: 1em;\n  margin: auto;\n  max-width: 42em;\n  background: #fefefe;\n}\n\na {\n  color: #0645ad;\n  text-decoration: none;\n}\n\na:visited {\n  color: #0b0080;\n}\n\na:hover {\n  color: #06e;\n}\n\na:active {\n  color: #faa700;\n}\n\na:focus {\n  outline: thin dotted;\n}\n\n*::-moz-selection {\n  background: rgba(255, 255, 0, 0.3);\n  color: #000;\n}\n\n*::selection {\n  background: rgba(255, 255, 0, 0.3);\n  color: #000;\n}\n\na::-moz-selection {\n  background: rgba(255, 255, 0, 0.3);\n  color: #0645ad;\n}\n\na::selection {\n  background: rgba(255, 255, 0, 0.3);\n  color: #0645ad;\n}\n\np {\n  margin: 1em 0;\n}\n\nimg {\n  max-width: 100%;\n}\n\nh1, h2, h3, h4, h5, h6 {\n  color: #111;\n  line-height: 125%;\n  margin-top: 2em;\n  font-weight: normal;\n}\n\nh4, h5, h6 {\n  font-weight: bold;\n}\n\nh1 {\n  font-size: 2.5em;\n}\n\nh2 {\n  font-size: 2em;\n}\n\nh3 {\n  font-size: 1.5em;\n}\n\nh4 {\n  font-size: 1.2em;\n}\n\nh5 {\n  font-size: 1em;\n}\n\nh6 {\n  font-size: 0.9em;\n}\n\nblockquote {\n  color: #666666;\n  margin: 0;\n  padding-left: 3em;\n  border-left: 0.5em #EEE solid;\n}\n\nhr {\n  display: block;\n  height: 2px;\n  border: 0;\n  border-top: 1px solid #aaa;\n  border-bottom: 1px solid #eee;\n  margin: 1em 0;\n  padding: 0;\n}\n\npre, code, kbd, samp {\n  color: #000;\n  font-family: monospace, monospace;\n  _font-family: \'courier new\', monospace;\n  font-size: 0.98em;\n}\n\npre {\n  white-space: pre;\n  white-space: pre-wrap;\n  word-wrap: break-word;\n}\n\nb, strong {\n  font-weight: bold;\n}\n\ndfn {\n  font-style: italic;\n}\n\nins {\n  background: #ff9;\n  color: #000;\n  text-decoration: none;\n}\n\nmark {\n  background: #ff0;\n  color: #000;\n  font-style: italic;\n  font-weight: bold;\n}\n\nsub, sup {\n  font-size: 75%;\n  line-height: 0;\n  position: relative;\n  vertical-align: baseline;\n}\n\nsup {\n  top: -0.5em;\n}\n\nsub {\n  bottom: -0.25em;\n}\n\nul, ol {\n  marg..." /* TRUNCATED STRING LITERAL */
              );
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                ::index_page_abi_cxx11_,"</head>\n\n  <body>\n    ");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                ::index_page_abi_cxx11_,
               "<svg version = \"1.1\" id = \"Layer_1\" xmlns =\n                                    \"http://www.w3.org/2000/svg\" xmlns:\n    xlink = \"http://www.w3.org/1999/xlink\" x = \"0px\" y = \"0px\"\n     viewBox=\"0 0 432 140.1\" style=\"enable-background:new 0 0 432 140.1;\" xml:space=\"preserve\" width=\"20%\">\n<style type=\"text/css\">\n    .st0{fill:#231F20;}\n    .st1{fill:url(#SVGID_1_);}\n    .st2{fill:url(#SVGID_2_);}\n    .st3{fill:url(#SVGID_3_);}\n    .st4{fill:url(#SVGID_4_);}\n    .st5{fill:url(#SVGID_5_);}\n    .st6{fill:#1D1D1D;}\n</style>\n<g>\n    <g>\n        <path class=\"st0\" d=\"M129.1,118.5c0.2,0.3,0.4,0.6,0.7,0.8c0.3,0.2,0.6,0.3,1,0.4c0.4,0.1,0.8,0.1,1.1,0.1c0.3,0,0.6,0,0.9-0.1\n            c0.3,0,0.6-0.1,0.9-0.3c0.3-0.1,0.5-0.3,0.7-0.5c0.2-0.2,0.3-0.5,0.3-0.8c0-0.4-0.1-0.7-0.4-0.9c-0.2-0.2-0.5-0.4-0.9-0.6\n            c-0.4-0.2-0.8-0.3-1.3-0.4s-1-0.2-1.5-0.4c-0.5-0.1-1-0.3-1.5-0.5c-0.5-0.2-0.9-0.4-1.3-0.7c-0.4-0.3-0.7-0.7-0.9-1.1\n            c-0.2-0.4-0.4-1-0.4-1.6c0-0.7,0.1-1.3,0.4-1.8c0.3-0.5,0.7-0.9,1.2-1.3c0.5-0.3,1-0.6,1.6-0.8c0.6-0.2,1.2-0.2,1.8-0.2\n            c0.7,0,1.4,0.1,2.1,0.2c0.7,0.2,1.2,0.4,1.7,0.8c0.5,0.4,0.9,0.8,1.2,1.4c0.3,0.6,0.4,1.2,0.4,2H134c0-0.4-0.1-0.7-0.3-1\n            c-0.1-0.3-0.3-0.5-0.6-0.6c-0.2-0.2-0.5-0.3-0.8-0.3c-0.3-0.1-0.7-0.1-1-0.1c-0.2,0-0.5,0-0.7,0.1c-0.2,0.1-0.5,0.1-0.7,0.3\n            c-0.2,0.1-0.4,0.3-0.5,0.5c-0.1,0.2-0.2,0.4-0.2,0.7c0,0.3,0.1,0.5,0.2,0.6c0.1,0.2,0.3,0.3,0.6,0.5c0.3,0.1,0.7,0.3,1.2,0.4\n            c0.5,0.1,1.2,0.3,2.1,0.5c0.3,0.1,0.6,0.1,1.1,0.3c0.5,0.1,0.9,0.3,1.3,0.6c0.4,0.3,0.8,0.7,1.2,1.2c0.3,0.5,0.5,1.1,0.5,1.9\n            c0,0.6-0.1,1.2-0.4,1.7c-0.2,0.5-0.6,1-1.1,1.4c-0.5,0.4-1.1,0.7-1.8,0.9s-1.5,0.3-2.5,0.3c-0.8,0-1.5-0.1-2.2-0.3\n            c-0.7-0.2-1.3-0.5-1.9-0.9c-0.5-0.4-1-0.9-1.3-1.5s-0.5-1.3-0.5-2.2h2.9C128.8,117.8,128.9,118.2,129.1,118.5z\"/>\n        <path class=\"st0\" d=\"M139,110.5v-2.2h2.7v2.2H139z M141.7,112v9.9H139V112H141.7z\"/>\n        <path class=\"st0\" d=\"M146.4,112v1.3h0c0.4-0.5,0.8-0.9,1.3-1.2c0.5-0.3,1.1-0.4,1.7-0.4c0.6,0,1.2,0.1,1.7,0.4s0.9,0.7,1.2,1.3\n  ..." /* TRUNCATED STRING LITERAL */
              );
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                ::index_page_abi_cxx11_,
               "\n<g>\n        <linearGradient id=\"SVGID_1_\" gradientUnits=\"userSpaceOnUse\" x1=\"30.5941\" y1=\"54.4356\" x2=\"30.5941\" y2=\"127.221\">\n            <stop  offset=\"0.1127\" style=\"stop-color:#235075\"/>\n            <stop  offset=\"0.7537\" style=\"stop-color:#0C96D0\"/>\n        </linearGradient>\n        <path class=\"st1\" d=\"M46.8,86.8L46.8,86.8c-17.9,0-32.3-14.5-32.3-32.3v72.8h0l0,0v0h32.3V95.7h0c0-0.3,0-0.5,0-0.8V86.8z\"/>\n\n            <linearGradient id=\"SVGID_2_\" gradientUnits=\"userSpaceOnUse\" x1=\"-239.4459\" y1=\"105.6518\" x2=\"-174.7478\" y2=\"105.6518\" gradientTransform=\"matrix(-1 0 0 -1 -128 176.2619)\">\n            <stop  offset=\"0.197\" style=\"stop-color:#144A71\"/>\n            <stop  offset=\"0.3768\" style=\"stop-color:#ADC5D1\"/>\n            <stop  offset=\"0.6305\" style=\"stop-color:#0C96D0\"/>\n            <stop  offset=\"0.8873\" style=\"stop-color:#235075\"/>\n        </linearGradient>\n        <path class=\"st2\" d=\"M46.7,54.4c0,17.9,14.5,32.3,32.3,32.3C79.1,68.9,64.6,54.4,46.7,54.4z\"/>\n        <linearGradient id=\"SVGID_3_\" gradientUnits=\"userSpaceOnUse\" x1=\"95.2714\" y1=\"86.7846\" x2=\"95.2714\" y2=\"13.9992\">\n            <stop  offset=\"0.1127\" style=\"stop-color:#235075\"/>\n            <stop  offset=\"0.7537\" style=\"stop-color:#0C96D0\"/>\n        </linearGradient>\n        <path class=\"st3\" d=\"M111.4,14H79.1v31.5h0c0,0.3,0,0.5,0,0.8v8.1h0c12,0,22.4,6.5,28,16.2c2.8,4.8,4.3,10.3,4.3,16.2L111.4,14\n            L111.4,14L111.4,14z\"/>\n        <linearGradient id=\"SVGID_4_\" gradientUnits=\"userSpaceOnUse\" x1=\"21.8517\" y1=\"75.288\" x2=\"64.9416\" y2=\"32.1981\">\n            <stop  offset=\"0.2463\" style=\"stop-color:#0C96D0\"/>\n            <stop  offset=\"0.8873\" style=\"stop-color:#235075\"/>\n        </linearGradient>\n        <path class=\"st4\" d=\"M46.7,54.4v-8.1c0-0.3,0-0.5,0-0.8h0V14H14.4v0l0,0h0v40.4v0c0,17.9,14.5,32.3,32.3,32.3h0h32.3\n            C61.2,86.8,46.7,72.3,46.7,54.4z\"/>\n        <linearGradient id=\"SVGID_5_\" gradientUnits=\"userSpaceOnUse\" x1=\"48.0744\" y1=\"53.109\" x2=\"116.8162\" y2=\"121.8507\">\n            <stop  offset=\"0.1127\" style=\"stop-color:#235075..." /* TRUNCATED STRING LITERAL */
              );
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                ::index_page_abi_cxx11_,
               "<br>\n    <h1>Web server interface</h1>\n    <h2>\n      <a href=\"https://github.com/GMLC-TDC/HELICS\">HELICS Source repository</a><br>\n      <a href=\"https://docs.helics.org/en/latest/index.html\"\n        >HELICS Documentation</a\n      ><br>\n\n<a href=\"https://docs.helics.org/en/latest/user-guide/advanced_topics/webserver.html\"\n        >Using the web server</a\n      ><br>\n\n<a href=\"https://docs.helics.org/en/latest/user-guide/advanced_topics/queries.html\"\n        >Available queries</a\n      ><br>\n    </h2>\n  </body>\n</html>\n"
              );
    __cxa_atexit(std::__cxx11::string::~string,
                 &handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                  ::index_page_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                         ::index_page_abi_cxx11_);
  }
  vVar1 = (req->super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
          method_;
  response_ok.req = req;
  bad_request.req = req;
  not_found.req = req;
  switch(vVar1) {
  case delete_:
    local_1bc = REMOVE;
    break;
  case get:
  case head:
  case search:
    local_1bc = QUERY;
    break;
  case post:
  case put:
    local_1bc = CREATE;
    break;
  default:
    why._M_str = "Unknown HTTP-method";
    why._M_len = 0x13;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()(&local_160,&bad_request,why);
    HttpSession::send_lambda::operator()(send,&local_160);
    goto LAB_001e45e6;
  case options:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reqpr,"{\"success\":true}",(allocator<char> *)&res);
    content_type_00._M_str = "application/json";
    content_type_00._M_len = 0x10;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()(&local_160,&response_ok,(string *)&reqpr,content_type_00);
    HttpSession::send_lambda::operator()(send,&local_160);
    goto LAB_001e46c4;
  }
  sVar2 = (req->super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
          super_basic_fields<std::allocator<char>_>.target_or_reason_._M_len;
  pcVar9 = (req->super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
           super_basic_fields<std::allocator<char>_>.target_or_reason_._M_str + (sVar2 != 0);
  sVar8 = 0;
  if (sVar2 != 0) {
    sVar8 = sVar2 - 1;
  }
  uVar3 = (req->
          super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
          ).value_._M_string_length;
  __y._M_str = "/index.html";
  __y._M_len = 0xb;
  __x._M_str = pcVar9;
  __x._M_len = sVar8;
  bVar5 = std::operator==(__x,__y);
  if (((bVar5) ||
      (__y_00._M_str = "index.html", __y_00._M_len = 10, __x_00._M_str = pcVar9,
      __x_00._M_len = sVar8, bVar5 = std::operator==(__x_00,__y_00), bVar5)) ||
     ((__y_01._M_str = "/", __y_01._M_len = 1, __x_01._M_str = pcVar9, __x_01._M_len = sVar8,
      bVar5 = std::operator==(__x_01,__y_01), bVar5 && (uVar3 < 4)))) {
    content_type._M_str = "text/html";
    content_type._M_len = 9;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()
              (&local_160,&response_ok,
               &handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                ::index_page_abi_cxx11_,content_type);
    HttpSession::send_lambda::operator()(send,&local_160);
LAB_001e45e6:
    boost::beast::http::
    message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
    ::~message(&local_160);
    return;
  }
  __y_02._M_str = "/healthcheck";
  __y_02._M_len = 0xc;
  __x_02._M_str = pcVar9;
  __x_02._M_len = sVar8;
  bVar5 = std::operator==(__x_02,__y_02);
  if ((bVar5) ||
     (__y_03._M_str = "healthcheck", __y_03._M_len = 0xb, __x_03._M_str = pcVar9,
     __x_03._M_len = sVar8, bVar5 = std::operator==(__x_03,__y_03), bVar5)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reqpr,"{\"success\":true}",(allocator<char> *)&res);
    content_type_01._M_str = "application/json";
    content_type_01._M_len = 0x10;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()(&local_160,&response_ok,(string *)&reqpr,content_type_01);
    HttpSession::send_lambda::operator()(send,&local_160);
LAB_001e46c4:
    boost::beast::http::
    message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
    ::~message(&local_160);
    std::__cxx11::string::~string((string *)&reqpr);
    return;
  }
  target._M_str = pcVar9;
  target._M_len = sVar8;
  body._M_str = (req->
                super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                ).value_._M_dataplus._M_p;
  body._M_len = (req->
                super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                ).value_._M_string_length;
  processRequestParameters_abi_cxx11_(&reqpr,target,body);
  brokerName._M_dataplus._M_p = (pointer)&brokerName.field_2;
  brokerName._M_string_length = 0;
  query._M_dataplus._M_p = (pointer)&query.field_2;
  query._M_string_length = 0;
  targetObj._M_dataplus._M_p = (pointer)&targetObj.field_2;
  targetObj._M_string_length = 0;
  brokerName.field_2._M_local_buf[0] = '\0';
  query.field_2._M_local_buf[0] = '\0';
  targetObj.field_2._M_local_buf[0] = '\0';
  local_160.super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.set_.
  super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .super_size_holder<true,_unsigned_long,_void>.size_ = reqpr.first._M_len;
  local_160.super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.set_.
  super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase2<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase3<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
  .holder.root.super_node.parent_ = (node_ptr)reqpr.first._M_str;
  if ((reqpr.first._M_len != 0) &&
     (((reqpr.first._M_str[reqpr.first._M_len - 1] != '/' ||
       (reqpr.first._M_len = reqpr.first._M_len - 1,
       local_160.super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
       super_basic_fields<std::allocator<char>_>.set_.
       super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
       .
       super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
       .
       super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
       .super_size_holder<true,_unsigned_long,_void>.size_ = reqpr.first._M_len,
       reqpr.first._M_len != 0)) &&
      (local_160.super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
       super_basic_fields<std::allocator<char>_>.set_.
       super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
       .
       super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
       .
       super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
       .super_size_holder<true,_unsigned_long,_void>.size_ = reqpr.first._M_len,
      *reqpr.first._M_str == '/')))) {
    local_160.super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
    super_basic_fields<std::allocator<char>_>.set_.
    super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase2<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase3<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
    .holder.root.super_node.parent_ = (node_ptr)(reqpr.first._M_str + 1);
    local_160.super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
    super_basic_fields<std::allocator<char>_>.set_.
    super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
    .super_size_holder<true,_unsigned_long,_void>.size_ = reqpr.first._M_len - 1;
  }
  sVar7 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_160,'/',0);
  if (sVar7 == 0xffffffffffffffff) {
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&brokerName,(basic_string_view<char,_std::char_traits<char>_> *)&local_160)
    ;
  }
  else {
    res._0_16_ = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&local_160,0,sVar7);
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&brokerName,(basic_string_view<char,_std::char_traits<char>_> *)&res);
    res._0_16_ = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&local_160,sVar7 + 1
                            ,0xffffffffffffffff);
    sVar7 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)&res,'/',0);
    if (sVar7 == 0xffffffffffffffff) {
      std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&targetObj,(basic_string_view<char,_std::char_traits<char>_> *)&res);
    }
    else {
      local_40 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&res,0,sVar7);
      std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&targetObj,&local_40);
      local_40 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&res,sVar7 + 1,
                            0xffffffffffffffff);
      std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&query,&local_40);
    }
  }
  if (vVar1 == post) {
    bVar5 = std::operator==(&brokerName,"delete");
    RVar4 = REMOVE;
    if ((!bVar5) && (bVar5 = std::operator==(&brokerName,"remove"), !bVar5)) {
      bVar5 = std::operator==(&brokerName,"create");
      if (bVar5) {
        RVar4 = CREATE;
      }
      else {
        bVar5 = std::operator==(&brokerName,"query");
        RVar4 = QUERY;
        if ((!bVar5) && (bVar5 = std::operator==(&brokerName,"search"), !bVar5)) {
          bVar5 = std::operator==(&brokerName,"command");
          if (!bVar5) goto LAB_001e4905;
          RVar4 = COMMAND;
        }
      }
    }
    local_1bc = RVar4;
    brokerName._M_string_length = 0;
    *brokerName._M_dataplus._M_p = '\0';
  }
LAB_001e4905:
  std::__cxx11::string::string((string *)&local_60,&brokerName);
  query_00._M_str = query._M_dataplus._M_p;
  query_00._M_len = query._M_string_length;
  target_00._M_str = targetObj._M_dataplus._M_p;
  target_00._M_len = targetObj._M_string_length;
  generateResults(&res,local_1bc,&local_60,target_00,query_00,&reqpr.second);
  std::__cxx11::string::~string((string *)&local_60);
  if (res.first == BAD_REQUEST) {
    why_01._M_str = res.second._M_dataplus._M_p;
    why_01._M_len = res.second._M_string_length;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()(&local_160,&bad_request,why_01);
    HttpSession::send_lambda::operator()(send,&local_160);
  }
  else if (res.first == NOT_FOUND) {
    why_00._M_str = res.second._M_dataplus._M_p;
    why_00._M_len = res.second._M_string_length;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()(&local_160,&not_found,why_00);
    HttpSession::send_lambda::operator()(send,&local_160);
  }
  else if (res.second._M_string_length == 0) {
    content_type_03._M_str = "text/html";
    content_type_03._M_len = 9;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()
              (&local_160,&response_ok,
               &handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>(boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>&&,HttpSession::send_lambda&)
                ::index_page_abi_cxx11_,content_type_03);
    HttpSession::send_lambda::operator()(send,&local_160);
  }
  else if (*res.second._M_dataplus._M_p == '{') {
    content_type_02._M_str = "application/json";
    content_type_02._M_len = 0x10;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()(&local_160,&response_ok,&res.second,content_type_02);
    HttpSession::send_lambda::operator()(send,&local_160);
  }
  else {
    content_type_04._M_str = "text/plain";
    content_type_04._M_len = 10;
    handle_request<boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<char>,_HttpSession::send_lambda_&>
    ::anon_class_8_1_ba1d73fe::operator()(&local_160,&response_ok,&res.second,content_type_04);
    HttpSession::send_lambda::operator()(send,&local_160);
  }
  boost::beast::http::
  message<false,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::~message(&local_160);
  std::__cxx11::string::~string((string *)&res.second);
  std::__cxx11::string::~string((string *)&targetObj);
  std::__cxx11::string::~string((string *)&query);
  std::__cxx11::string::~string((string *)&brokerName);
  boost::container::
  vector<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>
  ::~vector((vector<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>
             *)&reqpr.second);
  return;
}

Assistant:

void handle_request(http::request<Body, http::basic_fields<Allocator>>&& req, Send&& send)
{
    static const std::string index_page = generateIndexPage();
    // Returns a bad request response
    auto const bad_request = [&req](std::string_view why) {
        http::response<http::string_body> res{http::status::bad_request, req.version()};
        res.set(http::field::server, "HELICS_WEB_SERVER " HELICS_VERSION_STRING);
        res.set(http::field::content_type, "text/html");
        res.keep_alive(req.keep_alive());

        res.set(http::field::access_control_allow_origin, "*");

        res.body() = std::string(why);
        res.prepare_payload();
        return res;
    };

    // Returns a bad request response
    auto const not_found = [&req](std::string_view why) {
        http::response<http::string_body> res{http::status::not_found, req.version()};
        res.set(http::field::server, "HELICS_WEB_SERVER " HELICS_VERSION_STRING);
        res.set(http::field::content_type, "text/html");
        res.keep_alive(req.keep_alive());

        res.set(http::field::access_control_allow_origin, "*");

        res.body() = std::string(why);
        res.prepare_payload();
        return res;
    };

    // generate a conversion response
    auto const response_ok = [&req](const std::string& resp, std::string_view content_type) {
        http::response<http::string_body> res{http::status::ok, req.version()};
        res.set(http::field::server, "HELICS_WEB_SERVER " HELICS_VERSION_STRING);
        res.set(http::field::content_type, content_type);
        res.keep_alive(req.keep_alive());

        res.set(http::field::access_control_allow_origin, "*");
        res.set(http::field::access_control_allow_methods, "*");
        res.set(http::field::access_control_allow_headers, "*");

        if (req.method() != http::verb::head) {
            res.body() = resp;
            res.prepare_payload();
        } else {
            res.set(http::field::content_length, std::to_string(resp.size()));
        }
        return res;
    };

    RestCommand command{RestCommand::QUERY};

    auto method = req.method();
    switch (method) {
        case http::verb::head:
        case http::verb::search:
        case http::verb::get:
            break;
        case http::verb::post:
        case http::verb::put:
            command = RestCommand::CREATE;
            break;
        case http::verb::delete_:
            command = RestCommand::REMOVE;
            break;
        case http::verb::options:
            return send(response_ok("{\"success\":true}", "application/json"));
        default:
            return send(bad_request("Unknown HTTP-method"));
    }

    const std::string_view target(req.target());
    auto psize = req.payload_size();
    if (target == "/index.html" || target == "index.html" ||
        (target == "/" && (!psize || *psize < 4))) {
        return send(response_ok(index_page, "text/html"));
    }

    if (target == "/healthcheck" || target == "healthcheck") {
        return send(response_ok("{\"success\":true}", "application/json"));
    }

    auto reqpr = processRequestParameters(target, req.body());
    std::string brokerName;
    std::string query;
    std::string targetObj;

    partitionTarget(reqpr.first, brokerName, query, targetObj);

    if (method == http::verb::post) {
        if (brokerName == "delete" || brokerName == "remove") {
            command = RestCommand::REMOVE;
            brokerName.clear();
        } else if (brokerName == "create") {
            command = RestCommand::CREATE;
            brokerName.clear();
        } else if (brokerName == "query" || brokerName == "search") {
            command = RestCommand::QUERY;
            brokerName.clear();
        } else if (brokerName == "command") {
            command = RestCommand::COMMAND;
            brokerName.clear();
        }
    }
    auto res = generateResults(command, brokerName, targetObj, query, reqpr.second);
    switch (res.first) {
        case RequestReturnVal::BAD_REQUEST:
            return send(bad_request(res.second));
        case RequestReturnVal::NOT_FOUND:
            return send(not_found(res.second));
        case RequestReturnVal::OK:
        default:
            if (res.second.empty()) {
                return send(response_ok(index_page, "text/html"));
            }
            if (res.second.front() == '{') {
                return send(response_ok(res.second, "application/json"));
            }
            return send(response_ok(res.second, "text/plain"));
    }
}